

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void __thiscall
EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn> *this)

{
  key_type local_18;
  
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  use_empty_ = false;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = 0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.key_info.delkey = (type)0x0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.key_info.empty_key = (type)0x0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.num_deleted = 0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.num_elements = 0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.num_buckets = 0x20;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.table = (pointer)0x0;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  (this->
  super_dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_18 = (key_type)0xffffffffffffffff;
  google::
  dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ::set_empty_key((dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                   *)this,&local_18);
  return;
}

Assistant:

EasyUseDenseHashMap() { this->set_empty_key((K*)(~0)); }